

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

SiameseResult __thiscall
siamese::Encoder::GetStatistics(Encoder *this,uint64_t *statsOut,uint statsCount)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = pktalloc::Allocator::GetMemoryAllocatedBytes(&this->TheAllocator);
  (this->Stats).Counts[8] = (ulong)uVar1;
  if (statsCount != 0) {
    uVar2 = 9;
    if (statsCount < 9) {
      uVar2 = (ulong)statsCount;
    }
    uVar3 = 0;
    do {
      statsOut[uVar3] = (this->Stats).Counts[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return Siamese_Success;
}

Assistant:

SiameseResult Encoder::GetStatistics(uint64_t* statsOut, unsigned statsCount)
{
    if (statsCount > SiameseEncoderStats_Count)
        statsCount = SiameseEncoderStats_Count;

    // Fill in memory allocated
    Stats.Counts[SiameseEncoderStats_MemoryUsed] = TheAllocator.GetMemoryAllocatedBytes();

    for (unsigned i = 0; i < statsCount; ++i)
        statsOut[i] = Stats.Counts[i];

    return Siamese_Success;
}